

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_float64_primitive_asIEEEFloat64Decoded
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  double value;
  sysbvm_tuple_t sVar1;
  double floatValue;
  uint64_t uint64Value;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  value = (double)sysbvm_tuple_uint64_decode(*arguments);
  sVar1 = sysbvm_tuple_float64_encode(context,value);
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_float64_primitive_asIEEEFloat64Decoded(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    uint64_t uint64Value = sysbvm_tuple_uint64_decode(arguments[0]);
    double floatValue = 0;
    memcpy(&floatValue, &uint64Value, 8);

    return sysbvm_tuple_float64_encode(context, floatValue);
}